

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O2

void __thiscall PolyFit<double>::solveRLS(PolyFit<double> *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double __x;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  vector<int,_std::allocator<int>_> inliers;
  Matrix<double,__1,_1,_0,__1,_1> bestCoef;
  vector<int,_std::allocator<int>_> bestSubset;
  set<int,_std::less<int>,_std::allocator<int>_> indexSet;
  
  dVar5 = 0.0;
  bestSubset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  bestSubset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  bestSubset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bestCoef.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  bestCoef.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  iVar4 = 1;
  iVar3 = 0;
  do {
    if (iVar4 <= iVar3) {
LAB_00137bc6:
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&this->pCoef,&bestCoef);
      free(bestCoef.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&bestSubset.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    logging::log(&logger,dVar5);
    indexSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    indexSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    indexSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &indexSet._M_t._M_impl.super__Rb_tree_header._M_header;
    indexSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    indexSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         indexSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    randsample(this,(int)((ulong)((long)(this->y->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_finish -
                                 (long)(this->y->super__Vector_base<double,_std::allocator<double>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3) + -1,
               this->options->maxMPts,
               (set<int,_std::less<int>,_std::allocator<int>_> *)&indexSet._M_t);
    if (this->options->maxMPts != (int)indexSet._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      __assert_fail("static_cast<int>(indexSet.size()) == options.maxMPts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rkwitt[P]polyran/src/polyfit.h"
                    ,0x118,"void PolyFit<double>::solveRLS() [T = double]");
    }
    dataToEigenSubset(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&indexSet._M_t);
    buildV(this);
    dVar5 = solveLS(this);
    logging::log(&logger,dVar5);
    inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    getInliers(this,&inliers);
    dVar5 = logging::log(&logger,__x);
    if ((ulong)((long)bestSubset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bestSubset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) <
        (ulong)((long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start)) {
      std::vector<int,_std::allocator<int>_>::operator=(&bestSubset,&inliers);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&bestCoef,&this->pCoef);
      lVar2 = (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      auVar6._8_4_ = (int)((long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 0x22);
      auVar6._0_8_ = lVar2;
      auVar6._12_4_ = 0x45300000;
      lVar1 = (this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      dVar5 = (double)__powidf2(this->options->maxMPts);
      dVar5 = 1.0 - dVar5;
      if (dVar5 <= 1e-09) {
        dVar5 = 1e-09;
      }
      if (0.999999999 <= dVar5) {
        dVar5 = 0.999999999;
      }
      dVar5 = log(dVar5);
      iVar4 = (int)(-4.605170185988091 / dVar5);
      dVar5 = logging::log(&logger,(((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) +
                                   (auVar6._8_8_ - 1.9342813113834067e+25)) / (double)lVar1);
    }
    if (this->options->maxTrial <= iVar3) {
      logging::log(&logger,dVar5);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&inliers.super__Vector_base<int,_std::allocator<int>_>);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&indexSet._M_t);
      goto LAB_00137bc6;
    }
    iVar3 = iVar3 + 1;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&inliers.super__Vector_base<int,_std::allocator<int>_>);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&indexSet._M_t);
    dVar5 = extraout_XMM0_Qa;
  } while( true );
}

Assistant:

void solveRLS(void)
    {
      std::vector<int> bestSubset;
      Eigen::Matrix<T, Eigen::Dynamic, 1> bestCoef;
      
      // Probability that we can at least choose
      // one sample with options.maxMPts free of
      // outliers (sugg. by Peter Kovesi's code)
      double p = 0.99;

      int trialCount = 0; int N = 1;
      while (N > trialCount)
      {
        logger.log(DEBUG, "[%s]: Trial %d\n",
            __func__, trialCount);

        std::set<int> indexSet;
        randsample(static_cast<int>(y.size()-1),
            options.maxMPts, indexSet);

        assert(static_cast<int>(indexSet.size()) == options.maxMPts);

        // Build (sample,signal) for current subset
        dataToEigenSubset(indexSet);
        buildV();
        
        // Solve the LS-fitting problem
        double mse = solveLS();
         logger.log(DEBUG, "[%s]: MSE=%.8f in %d-th RLS trial\n",
            __func__, mse, trialCount);

        // Compute inlier indices
        std::vector<int> inliers;
        int nInliers = getInliers(inliers);    

        logger.log(DEBUG, "[%s]: #Inliers = %d\n",
            __func__, nInliers);

        if (inliers.size() > bestSubset.size())
        {
          // Store settings
          bestSubset = inliers;
          bestCoef = pCoef;

          // Refine estimate of N (based on Peter Kovesi's MATLAB impl. of RANSAC)
          double fracInliers = static_cast<double>(inliers.size())/double(yM.rows());
          double pNoOutliers = 1 - pow(fracInliers,options.maxMPts);
          pNoOutliers = std::max(1e-9, pNoOutliers);  
          pNoOutliers = std::min(1-1e-9, pNoOutliers);
          N = log(1-p)/log(pNoOutliers);

          logger.log(DEBUG, "[%s]: Inlier fraction=%.2f, P(Choose no outlier)=%.2f --> N=%d\n",
              __func__, fracInliers, pNoOutliers, N);
        }

        ++trialCount;
        if (trialCount > options.maxTrial)
        {
          logger.log(WARNING, "[%s]: Maximum nr. of trials (%d) reached!\n",
              __func__, options.maxTrial);
          break;
        }
      }
      pCoef = bestCoef;
    }